

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,int value)

{
  ostream *poVar1;
  int iVar2;
  ostringstream oss;
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  iVar2 = (int)this;
  std::ostream::operator<<((ostringstream *)local_190,iVar2);
  if (0xfe < iVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," (0x",4);
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
    poVar1 = (ostream *)std::ostream::operator<<(local_190,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( int value ) {
    std::ostringstream oss;
    oss << value;
    if( value >= 255 )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}